

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O3

void __thiscall
FascodeUtil::msg::_print
          (msg *this,ostream *out_stream,string *appname,string *character,string *label,
          COLOR_TYPE color,int numberspace,string *message)

{
  pointer pcVar1;
  ostream *poVar2;
  string *this_00;
  string local_68;
  string local_48;
  
  this_00 = &local_68;
  std::__ostream_insert<char,std::char_traits<char>>(out_stream,"\x1b[36m[",6);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out_stream,(appname->_M_dataplus)._M_p,appname->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]\x1b[m ",5);
  pcVar1 = (character->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + character->_M_string_length);
  pcVar1 = (label->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + label->_M_string_length);
  _echo_type((msg *)this_00,out_stream,&local_48,&local_68,numberspace,color);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out_stream,(message->_M_dataplus)._M_p,message->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void msg::_print(std::ostream& out_stream,std::string appname,std::string character,std::string label,COLOR_TYPE color,int numberspace,std::string message){

        out_stream << "\e[36m[" << appname << "]\e[m ";
        _echo_type(out_stream,character,label,numberspace,color);
        out_stream << message << std::endl;
    }